

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompose.hpp
# Opt level: O0

void __thiscall
MGARD::Decomposer<float>::decompose_level_1D
          (Decomposer<float> *this,float *data_pos,size_t n,float h,bool nodal_row)

{
  float *nodal_buffer_00;
  float *coeff_buffer_00;
  byte in_CL;
  size_t n_nodal_00;
  size_t n_coeff_00;
  ulong in_RDX;
  float *in_RSI;
  Decomposer<float> *in_RDI;
  float in_XMM0_Da;
  float *coeff_buffer;
  float *nodal_buffer;
  size_t n_coeff;
  size_t n_nodal;
  undefined3 in_stack_00000028;
  
  n_nodal_00 = (in_RDX >> 1) + 1;
  n_coeff_00 = in_RDX - n_nodal_00;
  nodal_buffer_00 = in_RDI->data_buffer;
  coeff_buffer_00 = in_RDI->data_buffer + n_nodal_00;
  data_reorder_1D<float>(in_RSI,n_nodal_00,n_coeff_00,nodal_buffer_00,coeff_buffer_00);
  compute_interpolant_difference_1D(in_RDI,n_coeff_00,nodal_buffer_00,coeff_buffer_00);
  if ((in_CL & 1) == 0) {
    compute_load_vector_coeff_row<float>
              (in_RDI->load_v_buffer,n_nodal_00,n_coeff_00,in_XMM0_Da,nodal_buffer_00,
               coeff_buffer_00);
  }
  else {
    compute_load_vector_nodal_row<float>
              (in_RDI->load_v_buffer,n_nodal_00,n_coeff_00,in_XMM0_Da,coeff_buffer_00);
  }
  compute_correction<float>
            ((float *)this,(size_t)data_pos,n._4_4_,(float *)CONCAT44(h,_in_stack_00000028));
  add_correction(in_RDI,n_nodal_00,nodal_buffer_00);
  memcpy(in_RSI,in_RDI->data_buffer,in_RDX << 2);
  return;
}

Assistant:

void decompose_level_1D(T * data_pos, size_t n, T h, bool nodal_row=true){
		size_t n_nodal = (n >> 1) + 1;
		size_t n_coeff = n - n_nodal;
		T * nodal_buffer = data_buffer;
		T * coeff_buffer = data_buffer + n_nodal;
		data_reorder_1D(data_pos, n_nodal, n_coeff, nodal_buffer, coeff_buffer);
		compute_interpolant_difference_1D(n_coeff, nodal_buffer, coeff_buffer);
		if(nodal_row) compute_load_vector_nodal_row(load_v_buffer, n_nodal, n_coeff, h, coeff_buffer);
        else compute_load_vector_coeff_row(load_v_buffer, n_nodal, n_coeff, h, nodal_buffer, coeff_buffer);
		compute_correction(correction_buffer, n_nodal, h, load_v_buffer);
		add_correction(n_nodal, nodal_buffer);
		memcpy(data_pos, data_buffer, n*sizeof(T));
	}